

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::
     WriteConstantDelta(long constant,unsigned_long frame_of_reference,idx_t count,
                       unsigned_long *values,bool *validity,void *data_ptr)

{
  atomic<unsigned_long> *paVar1;
  unsigned_long *puVar2;
  pointer pCVar3;
  
  ReserveSpace((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,0x10);
  WriteMetaData((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,CONSTANT_DELTA);
  puVar2 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar2 = frame_of_reference;
  puVar2[1] = constant;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar2 + 2;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}